

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBackwardCompatibility.cpp
# Opt level: O0

void anon_unknown.dwarf_2d24c::generateScanlineInterleavedImage(char *fn)

{
  int iVar1;
  RZ *pRVar2;
  char *pcVar3;
  undefined4 *puVar4;
  char *in_RDI;
  OutputFile file;
  FrameBuffer fb;
  Header header;
  Box2i dod;
  int j;
  int i;
  Array2D<(anonymous_namespace)::RZ> rz;
  Header *in_stack_000004b0;
  float in_stack_fffffffffffffdcc;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffdd4;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  Array2D<(anonymous_namespace)::RZ> *in_stack_fffffffffffffde0;
  long in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  undefined1 local_178 [72];
  Slice local_130 [56];
  char local_f8 [48];
  Channel local_c8 [16];
  Channel local_b8 [16];
  Vec2<float> local_a8;
  Header local_a0 [56];
  Vec2<float> local_68;
  Vec2<int> local_60;
  Vec2<float> local_58;
  Vec2<int> local_50;
  Box local_48 [18];
  uint16_t local_36;
  int local_34;
  int local_30;
  Array2D<(anonymous_namespace)::RZ> local_20;
  char *local_8;
  
  local_8 = in_RDI;
  Imf_3_2::Array2D<(anonymous_namespace)::RZ>::Array2D
            (in_stack_fffffffffffffde0,CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8)
             ,CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
  Imf_3_2::Array2D<(anonymous_namespace)::RZ>::resizeErase
            ((Array2D<(anonymous_namespace)::RZ> *)
             CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),in_stack_fffffffffffffde8
             ,(long)in_stack_fffffffffffffde0);
  for (local_30 = 0; local_30 < 0xc5; local_30 = local_30 + 1) {
    for (local_34 = 0; local_34 < 0xd9; local_34 = local_34 + 1) {
      iVar1 = local_30 * 0xd9 + local_34;
      pRVar2 = Imf_3_2::Array2D<(anonymous_namespace)::RZ>::operator[](&local_20,(long)local_30);
      pRVar2[local_34].z = (float)iVar1 / 42749.0;
      Imf_3_2::Array2D<(anonymous_namespace)::RZ>::operator[](&local_20,(long)local_30);
      Imath_3_2::half::half
                ((half *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                 in_stack_fffffffffffffdcc);
      pRVar2 = Imf_3_2::Array2D<(anonymous_namespace)::RZ>::operator[](&local_20,(long)local_30);
      pRVar2[local_34].g._h = local_36;
    }
  }
  Imath_3_2::Vec2<float>::Vec2(&local_58,20.0);
  Imath_3_2::Vec2<int>::Vec2<float>(&local_50,&local_58);
  Imath_3_2::Vec2<float>::Vec2(&local_68,197.0,174.0);
  Imath_3_2::Vec2<int>::Vec2<float>(&local_60,&local_68);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            ((Box<Imath_3_2::Vec2<int>_> *)in_stack_fffffffffffffde0,
             (Vec2<int> *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
             (Vec2<int> *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
  Imath_3_2::Vec2<float>::Vec2(&local_a8,0.0,0.0);
  Imf_3_2::Header::Header
            (local_a0,0xd9,0xc5,local_48,1.0,(Vec2 *)&local_a8,1.0,INCREASING_Y,ZIP_COMPRESSION);
  pcVar3 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel(local_b8,FLOAT,1,1,false);
  Imf_3_2::ChannelList::insert(pcVar3,(Channel *)0x250539);
  pcVar3 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel(local_c8,HALF,1,1,false);
  Imf_3_2::ChannelList::insert(pcVar3,(Channel *)0x243823);
  puVar4 = (undefined4 *)Imf_3_2::Header::compression();
  *puVar4 = 0;
  addUserAttributesToHeader(in_stack_000004b0);
  Imf_3_2::FrameBuffer::FrameBuffer((FrameBuffer *)0x13f4d0);
  pRVar2 = Imf_3_2::Array2D<(anonymous_namespace)::RZ>::operator[](&local_20,0);
  Imf_3_2::Slice::Slice(local_130,FLOAT,(char *)pRVar2,8,0x6c8,1,1,0.0,false,false);
  Imf_3_2::FrameBuffer::insert(local_f8,(Slice *)0x250539);
  pRVar2 = Imf_3_2::Array2D<(anonymous_namespace)::RZ>::operator[](&local_20,0);
  uVar5 = 0;
  Imf_3_2::Slice::Slice
            ((Slice *)(local_178 + 0x10),HALF,(char *)&pRVar2->g,8,0x6c8,1,1,0.0,false,false);
  Imf_3_2::FrameBuffer::insert(local_f8,(Slice *)0x243836);
  iVar1 = Imf_3_2::globalThreadCount();
  Imf_3_2::OutputFile::OutputFile((OutputFile *)local_178,local_8,local_a0,iVar1);
  Imf_3_2::OutputFile::setFrameBuffer((FrameBuffer *)local_178);
  Imf_3_2::OutputFile::writePixels((int)local_178);
  Imf_3_2::OutputFile::~OutputFile((OutputFile *)local_178);
  Imf_3_2::FrameBuffer::~FrameBuffer((FrameBuffer *)0x13f650);
  Imf_3_2::Header::~Header(local_a0);
  Imf_3_2::Array2D<(anonymous_namespace)::RZ>::~Array2D
            ((Array2D<(anonymous_namespace)::RZ> *)CONCAT44(in_stack_fffffffffffffdd4,uVar5));
  return;
}

Assistant:

void
generateScanlineInterleavedImage (const char* fn)
{
    // generate a v 1.7 image and check against ground truth on disk
    Array2D<RZ> rz (H, W);
    rz.resizeErase (H, W);

    for (int i = 0; i < H; i++)
    {
        for (int j = 0; j < W; j++)
        {
            rz[i][j].z = (float) ((i * W + j) / (float (W * H)));
            rz[i][j].g = (half) (rz[i][j].z);
        }
    }

    IMATH_NAMESPACE::Box2i dod (
        IMATH_NAMESPACE::V2f (20), IMATH_NAMESPACE::V2f (W - 20, H - 23));
    OPENEXR_IMF_NAMESPACE::Header header = Header (W, H, dod);
    header.channels ().insert ("Z", Channel (IMF::FLOAT));
    header.channels ().insert ("R", Channel (IMF::HALF));
    header.compression () = NO_COMPRESSION;
    addUserAttributesToHeader (header);

    FrameBuffer fb;

    fb.insert (
        "Z",
        Slice (
            IMF::FLOAT,
            (char*) &(rz[0][0].z),
            sizeof (rz[0][0]),
            sizeof (rz[0][0]) * W));

    fb.insert (
        "G",
        Slice (
            IMF::HALF,
            (char*) &(rz[0][0].g),
            sizeof (rz[0][0]),
            sizeof (rz[0][0]) * W));

    OutputFile file (fn, header);
    file.setFrameBuffer (fb);
    file.writePixels (dod.max.y - dod.min.y + 1);
}